

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttcolr.c
# Opt level: O0

FT_Error tt_face_colr_blend_layer
                   (TT_Face face,FT_UInt color_index,FT_GlyphSlot dstSlot,FT_GlyphSlot srcSlot)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  uint uVar4;
  int iVar5;
  ulong size_00;
  FT_Byte *buffer;
  int local_d0;
  int local_cc;
  int local_c8;
  int local_c4;
  int ba;
  int br;
  int bg;
  int bb;
  int ba2;
  int fr;
  int fg;
  int fb;
  int fa;
  int aa;
  FT_Byte *q;
  FT_Byte *p;
  FT_Byte *buf;
  FT_UInt pitch;
  FT_UInt rows;
  FT_UInt width;
  FT_Memory memory;
  FT_Int y_max;
  FT_Int y_min;
  FT_Int x_max;
  FT_Int x_min;
  FT_Byte *dst;
  FT_Byte *src;
  FT_ULong size;
  FT_Byte alpha;
  FT_Byte r;
  FT_Byte g;
  FT_Byte b;
  FT_UInt y;
  FT_UInt x;
  FT_Error error;
  FT_GlyphSlot srcSlot_local;
  FT_GlyphSlot dstSlot_local;
  TT_Face pTStack_18;
  FT_UInt color_index_local;
  TT_Face face_local;
  
  _x = srcSlot;
  srcSlot_local = dstSlot;
  dstSlot_local._4_4_ = color_index;
  pTStack_18 = face;
  if ((dstSlot->bitmap).buffer == (uchar *)0x0) {
    dstSlot->bitmap_left = srcSlot->bitmap_left;
    dstSlot->bitmap_top = srcSlot->bitmap_top;
    (dstSlot->bitmap).width = (srcSlot->bitmap).width;
    (dstSlot->bitmap).rows = (srcSlot->bitmap).rows;
    (dstSlot->bitmap).pixel_mode = '\a';
    (dstSlot->bitmap).pitch = (dstSlot->bitmap).width << 2;
    (dstSlot->bitmap).num_grays = 0x100;
    size_00 = (ulong)((dstSlot->bitmap).rows * (dstSlot->bitmap).pitch);
    y = ft_glyphslot_alloc_bitmap(dstSlot,size_00);
    if (y != 0) {
      return y;
    }
    memset((srcSlot_local->bitmap).buffer,0,size_00);
  }
  else {
    if (dstSlot->bitmap_left < srcSlot->bitmap_left) {
      local_c4 = dstSlot->bitmap_left;
    }
    else {
      local_c4 = srcSlot->bitmap_left;
    }
    if ((int)(srcSlot->bitmap_left + (srcSlot->bitmap).width) <
        (int)(dstSlot->bitmap_left + (dstSlot->bitmap).width)) {
      local_c8 = dstSlot->bitmap_left + (dstSlot->bitmap).width;
    }
    else {
      local_c8 = srcSlot->bitmap_left + (srcSlot->bitmap).width;
    }
    if ((int)(dstSlot->bitmap_top - (dstSlot->bitmap).rows) <
        (int)(srcSlot->bitmap_top - (srcSlot->bitmap).rows)) {
      local_cc = dstSlot->bitmap_top - (dstSlot->bitmap).rows;
    }
    else {
      local_cc = srcSlot->bitmap_top - (srcSlot->bitmap).rows;
    }
    if (srcSlot->bitmap_top < dstSlot->bitmap_top) {
      local_d0 = dstSlot->bitmap_top;
    }
    else {
      local_d0 = srcSlot->bitmap_top;
    }
    if ((((local_c4 != dstSlot->bitmap_left) ||
         (local_c8 != dstSlot->bitmap_left + (dstSlot->bitmap).width)) ||
        (local_cc != dstSlot->bitmap_top - (dstSlot->bitmap).rows)) ||
       (local_d0 != dstSlot->bitmap_top)) {
      uVar4 = (local_c8 - local_c4) * 4;
      buffer = (FT_Byte *)
               ft_mem_alloc((face->root).memory,(ulong)((local_d0 - local_cc) * uVar4),
                            (FT_Error *)&y);
      if (y != 0) {
        return y;
      }
      q = (srcSlot_local->bitmap).buffer;
      _fa = buffer + (long)((srcSlot_local->bitmap_left - local_c4) * 4) +
                     (long)(int)(uVar4 * (local_d0 - srcSlot_local->bitmap_top));
      for (size._4_4_ = 0; size._4_4_ < (srcSlot_local->bitmap).rows; size._4_4_ = size._4_4_ + 1) {
        memcpy(_fa,q,(ulong)((srcSlot_local->bitmap).width << 2));
        q = q + (srcSlot_local->bitmap).pitch;
        _fa = _fa + uVar4;
      }
      ft_glyphslot_set_bitmap(srcSlot_local,buffer);
      srcSlot_local->bitmap_top = local_d0;
      srcSlot_local->bitmap_left = local_c4;
      (srcSlot_local->bitmap).width = local_c8 - local_c4;
      (srcSlot_local->bitmap).rows = local_d0 - local_cc;
      (srcSlot_local->bitmap).pitch = uVar4;
      srcSlot_local->internal->flags = srcSlot_local->internal->flags | 1;
      srcSlot_local->format = FT_GLYPH_FORMAT_BITMAP;
    }
  }
  if (dstSlot_local._4_4_ == 0xffff) {
    if (pTStack_18->have_foreground_color == '\0') {
      if (((pTStack_18->palette_data).palette_flags == (FT_UShort *)0x0) ||
         (((pTStack_18->palette_data).palette_flags[pTStack_18->palette_index] & 2) == 0)) {
        size._3_1_ = 0;
        size._2_1_ = 0;
        size._1_1_ = 0;
      }
      else {
        size._3_1_ = 0xff;
        size._2_1_ = 0xff;
        size._1_1_ = 0xff;
      }
      size._0_1_ = 0xff;
    }
    else {
      size._3_1_ = (pTStack_18->foreground_color).blue;
      size._2_1_ = (pTStack_18->foreground_color).green;
      size._1_1_ = (pTStack_18->foreground_color).red;
      size._0_1_ = (pTStack_18->foreground_color).alpha;
    }
  }
  else {
    size._3_1_ = pTStack_18->palette[dstSlot_local._4_4_].blue;
    size._2_1_ = pTStack_18->palette[dstSlot_local._4_4_].green;
    size._1_1_ = pTStack_18->palette[dstSlot_local._4_4_].red;
    size._0_1_ = pTStack_18->palette[dstSlot_local._4_4_].alpha;
  }
  dst = (_x->bitmap).buffer;
  _x_max = (srcSlot_local->bitmap).buffer +
           (long)((_x->bitmap_left - srcSlot_local->bitmap_left) * 4) +
           (long)((srcSlot_local->bitmap).pitch * (srcSlot_local->bitmap_top - _x->bitmap_top));
  for (size._4_4_ = 0; size._4_4_ < (_x->bitmap).rows; size._4_4_ = size._4_4_ + 1) {
    for (_alpha = 0; _alpha < (_x->bitmap).width; _alpha = _alpha + 1) {
      uVar4 = ((uint)(byte)size * (uint)dst[_alpha]) / 0xff;
      iVar5 = 0xff - uVar4;
      bVar1 = _x_max[_alpha * 4 + 1];
      bVar2 = _x_max[_alpha * 4 + 2];
      bVar3 = _x_max[_alpha * 4 + 3];
      _x_max[_alpha << 2] =
           (char)((int)((uint)_x_max[_alpha << 2] * iVar5) / 0xff) +
           (char)((size._3_1_ * uVar4) / 0xff);
      _x_max[_alpha * 4 + 1] =
           (char)((int)((uint)bVar1 * iVar5) / 0xff) + (char)((size._2_1_ * uVar4) / 0xff);
      _x_max[_alpha * 4 + 2] =
           (char)((int)((uint)bVar2 * iVar5) / 0xff) + (char)((size._1_1_ * uVar4) / 0xff);
      _x_max[_alpha * 4 + 3] = (char)((int)((uint)bVar3 * iVar5) / 0xff) + (char)uVar4;
    }
    dst = dst + (_x->bitmap).pitch;
    _x_max = _x_max + (srcSlot_local->bitmap).pitch;
  }
  return 0;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  tt_face_colr_blend_layer( TT_Face       face,
                            FT_UInt       color_index,
                            FT_GlyphSlot  dstSlot,
                            FT_GlyphSlot  srcSlot )
  {
    FT_Error  error;

    FT_UInt  x, y;
    FT_Byte  b, g, r, alpha;

    FT_ULong  size;
    FT_Byte*  src;
    FT_Byte*  dst;


    if ( !dstSlot->bitmap.buffer )
    {
      /* Initialize destination of color bitmap */
      /* with the size of first component.      */
      dstSlot->bitmap_left = srcSlot->bitmap_left;
      dstSlot->bitmap_top  = srcSlot->bitmap_top;

      dstSlot->bitmap.width      = srcSlot->bitmap.width;
      dstSlot->bitmap.rows       = srcSlot->bitmap.rows;
      dstSlot->bitmap.pixel_mode = FT_PIXEL_MODE_BGRA;
      dstSlot->bitmap.pitch      = (int)dstSlot->bitmap.width * 4;
      dstSlot->bitmap.num_grays  = 256;

      size = dstSlot->bitmap.rows * (unsigned int)dstSlot->bitmap.pitch;

      error = ft_glyphslot_alloc_bitmap( dstSlot, size );
      if ( error )
        return error;

      FT_MEM_ZERO( dstSlot->bitmap.buffer, size );
    }
    else
    {
      /* Resize destination if needed such that new component fits. */
      FT_Int  x_min, x_max, y_min, y_max;


      x_min = FT_MIN( dstSlot->bitmap_left, srcSlot->bitmap_left );
      x_max = FT_MAX( dstSlot->bitmap_left + (FT_Int)dstSlot->bitmap.width,
                      srcSlot->bitmap_left + (FT_Int)srcSlot->bitmap.width );

      y_min = FT_MIN( dstSlot->bitmap_top - (FT_Int)dstSlot->bitmap.rows,
                      srcSlot->bitmap_top - (FT_Int)srcSlot->bitmap.rows );
      y_max = FT_MAX( dstSlot->bitmap_top, srcSlot->bitmap_top );

      if ( x_min != dstSlot->bitmap_left                                 ||
           x_max != dstSlot->bitmap_left + (FT_Int)dstSlot->bitmap.width ||
           y_min != dstSlot->bitmap_top - (FT_Int)dstSlot->bitmap.rows   ||
           y_max != dstSlot->bitmap_top                                  )
      {
        FT_Memory  memory = face->root.memory;

        FT_UInt  width = (FT_UInt)( x_max - x_min );
        FT_UInt  rows  = (FT_UInt)( y_max - y_min );
        FT_UInt  pitch = width * 4;

        FT_Byte*  buf = NULL;
        FT_Byte*  p;
        FT_Byte*  q;


        size  = rows * pitch;
        if ( FT_ALLOC( buf, size ) )
          return error;

        p = dstSlot->bitmap.buffer;
        q = buf +
            (int)pitch * ( y_max - dstSlot->bitmap_top ) +
            4 * ( dstSlot->bitmap_left - x_min );

        for ( y = 0; y < dstSlot->bitmap.rows; y++ )
        {
          FT_MEM_COPY( q, p, dstSlot->bitmap.width * 4 );

          p += dstSlot->bitmap.pitch;
          q += pitch;
        }

        ft_glyphslot_set_bitmap( dstSlot, buf );

        dstSlot->bitmap_top  = y_max;
        dstSlot->bitmap_left = x_min;

        dstSlot->bitmap.width = width;
        dstSlot->bitmap.rows  = rows;
        dstSlot->bitmap.pitch = (int)pitch;

        dstSlot->internal->flags |= FT_GLYPH_OWN_BITMAP;
        dstSlot->format           = FT_GLYPH_FORMAT_BITMAP;
      }
    }

    if ( color_index == 0xFFFF )
    {
      if ( face->have_foreground_color )
      {
        b     = face->foreground_color.blue;
        g     = face->foreground_color.green;
        r     = face->foreground_color.red;
        alpha = face->foreground_color.alpha;
      }
      else
      {
        if ( face->palette_data.palette_flags                          &&
             ( face->palette_data.palette_flags[face->palette_index] &
                 FT_PALETTE_FOR_DARK_BACKGROUND                      ) )
        {
          /* white opaque */
          b     = 0xFF;
          g     = 0xFF;
          r     = 0xFF;
          alpha = 0xFF;
        }
        else
        {
          /* black opaque */
          b     = 0x00;
          g     = 0x00;
          r     = 0x00;
          alpha = 0xFF;
        }
      }
    }
    else
    {
      b     = face->palette[color_index].blue;
      g     = face->palette[color_index].green;
      r     = face->palette[color_index].red;
      alpha = face->palette[color_index].alpha;
    }

    /* XXX Convert if srcSlot.bitmap is not grey? */
    src = srcSlot->bitmap.buffer;
    dst = dstSlot->bitmap.buffer +
          dstSlot->bitmap.pitch * ( dstSlot->bitmap_top - srcSlot->bitmap_top ) +
          4 * ( srcSlot->bitmap_left - dstSlot->bitmap_left );

    for ( y = 0; y < srcSlot->bitmap.rows; y++ )
    {
      for ( x = 0; x < srcSlot->bitmap.width; x++ )
      {
        int  aa = src[x];
        int  fa = alpha * aa / 255;

        int  fb = b * fa / 255;
        int  fg = g * fa / 255;
        int  fr = r * fa / 255;

        int  ba2 = 255 - fa;

        int  bb = dst[4 * x + 0];
        int  bg = dst[4 * x + 1];
        int  br = dst[4 * x + 2];
        int  ba = dst[4 * x + 3];


        dst[4 * x + 0] = (FT_Byte)( bb * ba2 / 255 + fb );
        dst[4 * x + 1] = (FT_Byte)( bg * ba2 / 255 + fg );
        dst[4 * x + 2] = (FT_Byte)( br * ba2 / 255 + fr );
        dst[4 * x + 3] = (FT_Byte)( ba * ba2 / 255 + fa );
      }

      src += srcSlot->bitmap.pitch;
      dst += dstSlot->bitmap.pitch;
    }

    return FT_Err_Ok;
  }